

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

void __thiscall Assimp::FileSystemFilter::BuildPath(FileSystemFilter *this,string *in)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  string local_a0 [32];
  long local_80;
  size_type dirsep;
  size_type last_dirsep;
  string tmp_1;
  size_type pos;
  undefined1 local_38 [8];
  string tmp;
  string *in_local;
  FileSystemFilter *this_local;
  
  tmp.field_2._8_8_ = in;
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                  ,0xe1,"void Assimp::FileSystemFilter::BuildPath(std::string &) const");
  }
  uVar3 = std::__cxx11::string::length();
  if ((2 < uVar3) && (bVar2 = IOSystem::Exists(this->mWrapped,(string *)tmp.field_2._8_8_), !bVar2))
  {
    pcVar4 = (char *)std::__cxx11::string::operator[](tmp.field_2._8_8_);
    if (*pcVar4 != ':') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     &this->mBase,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tmp.field_2._8_8_);
      bVar2 = IOSystem::Exists(this->mWrapped,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)tmp.field_2._8_8_,(string *)local_38);
      }
      std::__cxx11::string::~string((string *)local_38);
      if (bVar2) {
        return;
      }
    }
    tmp_1.field_2._8_8_ = std::__cxx11::string::rfind((char)tmp.field_2._8_8_,0x2f);
    if (tmp_1.field_2._8_8_ == -1) {
      tmp_1.field_2._8_8_ = std::__cxx11::string::rfind((char)tmp.field_2._8_8_,0x5c);
    }
    if (tmp_1.field_2._8_8_ != -1) {
      std::__cxx11::string::string((string *)&last_dirsep);
      dirsep = 0xffffffffffffffff;
      do {
        std::__cxx11::string::operator=((string *)&last_dirsep,(string *)&this->mBase);
        std::__cxx11::string::operator+=((string *)&last_dirsep,this->mSep);
        local_80 = std::__cxx11::string::rfind((char)tmp.field_2._8_8_,0x2f);
        if (local_80 == -1) {
          local_80 = std::__cxx11::string::rfind((char)tmp.field_2._8_8_,0x5c);
        }
        uVar1 = tmp.field_2._8_8_;
        if ((local_80 == -1) || (local_80 == 0)) goto LAB_0016bf02;
        dirsep = local_80 - 1;
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_a0,uVar1);
        std::__cxx11::string::operator+=((string *)&last_dirsep,local_a0);
        std::__cxx11::string::~string(local_a0);
        bVar2 = IOSystem::Exists(this->mWrapped,(string *)&last_dirsep);
      } while (!bVar2);
      std::__cxx11::string::operator=((string *)tmp.field_2._8_8_,(string *)&last_dirsep);
LAB_0016bf02:
      std::__cxx11::string::~string((string *)&last_dirsep);
    }
  }
  return;
}

Assistant:

void BuildPath (std::string& in) const {
        ai_assert( nullptr != mWrapped );
        // if we can already access the file, great.
        if (in.length() < 3 || mWrapped->Exists(in)) {
            return;
        }

        // Determine whether this is a relative path (Windows-specific - most assets are packaged on Windows).
        if (in[1] != ':') {

            // append base path and try
            const std::string tmp = mBase + in;
            if (mWrapped->Exists(tmp)) {
                in = tmp;
                return;
            }
        }

        // Chop of the file name and look in the model directory, if
        // this fails try all sub paths of the given path, i.e.
        // if the given path is foo/bar/something.lwo, try
        // <base>/something.lwo
        // <base>/bar/something.lwo
        // <base>/foo/bar/something.lwo
        std::string::size_type pos = in.rfind('/');
        if (std::string::npos == pos) {
            pos = in.rfind('\\');
        }

        if (std::string::npos != pos)   {
            std::string tmp;
            std::string::size_type last_dirsep = std::string::npos;

            while(true) {
                tmp = mBase;
                tmp += mSep;

                std::string::size_type dirsep = in.rfind('/', last_dirsep);
                if (std::string::npos == dirsep) {
                    dirsep = in.rfind('\\', last_dirsep);
                }

                if (std::string::npos == dirsep || dirsep == 0) {
                    // we did try this already.
                    break;
                }

                last_dirsep = dirsep-1;

                tmp += in.substr(dirsep+1, in.length()-pos);
                if (mWrapped->Exists(tmp)) {
                    in = tmp;
                    return;
                }
            }
        }

        // hopefully the underlying file system has another few tricks to access this file ...
    }